

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

int do_connect(Curl_cfilter *cf,Curl_easy *data,_Bool is_tcp_fastopen)

{
  int iVar1;
  int local_30;
  undefined4 local_2c;
  int rc;
  int optval;
  cf_socket_ctx *ctx;
  Curl_easy *pCStack_18;
  _Bool is_tcp_fastopen_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  _rc = cf->ctx;
  local_2c = 1;
  ctx._7_1_ = is_tcp_fastopen;
  pCStack_18 = data;
  data_local = (Curl_easy *)cf;
  if (is_tcp_fastopen) {
    iVar1 = setsockopt(*(int *)((long)_rc + 0x98),6,0x1e,&local_2c,4);
    if ((((iVar1 < 0) && (pCStack_18 != (Curl_easy *)0x0)) &&
        ((*(ulong *)&(pCStack_18->set).field_0x89c >> 0x1e & 1) != 0)) &&
       (((pCStack_18->state).feat == (curl_trc_feat *)0x0 ||
        (0 < ((pCStack_18->state).feat)->log_level)))) {
      Curl_infof(pCStack_18,"Failed to enable TCP Fast Open on fd %d",
                 (ulong)*(uint *)((long)_rc + 0x98));
    }
    local_30 = connect(*(int *)((long)_rc + 0x98),(sockaddr *)((long)_rc + 0x18),
                       *(socklen_t *)((long)_rc + 0x14));
  }
  else {
    local_30 = connect(*(int *)((long)_rc + 0x98),(sockaddr *)((long)_rc + 0x18),
                       *(socklen_t *)((long)_rc + 0x14));
  }
  return local_30;
}

Assistant:

static int do_connect(struct Curl_cfilter *cf, struct Curl_easy *data,
                      bool is_tcp_fastopen)
{
  struct cf_socket_ctx *ctx = cf->ctx;
#ifdef TCP_FASTOPEN_CONNECT
  int optval = 1;
#endif
  int rc = -1;

  (void)data;
  if(is_tcp_fastopen) {
#if defined(CONNECT_DATA_IDEMPOTENT) /* Darwin */
#  if defined(HAVE_BUILTIN_AVAILABLE)
    /* while connectx function is available since macOS 10.11 / iOS 9,
       it did not have the interface declared correctly until
       Xcode 9 / macOS SDK 10.13 */
    if(__builtin_available(macOS 10.11, iOS 9.0, tvOS 9.0, watchOS 2.0, *)) {
      sa_endpoints_t endpoints;
      endpoints.sae_srcif = 0;
      endpoints.sae_srcaddr = NULL;
      endpoints.sae_srcaddrlen = 0;
      endpoints.sae_dstaddr = &ctx->addr.curl_sa_addr;
      endpoints.sae_dstaddrlen = ctx->addr.addrlen;

      rc = connectx(ctx->sock, &endpoints, SAE_ASSOCID_ANY,
                    CONNECT_RESUME_ON_READ_WRITE | CONNECT_DATA_IDEMPOTENT,
                    NULL, 0, NULL, NULL);
    }
    else {
      rc = connect(ctx->sock, &ctx->addr.curl_sa_addr, ctx->addr.addrlen);
    }
#  else
    rc = connect(ctx->sock, &ctx->addr.curl_sa_addr, ctx->addr.addrlen);
#  endif /* HAVE_BUILTIN_AVAILABLE */
#elif defined(TCP_FASTOPEN_CONNECT) /* Linux >= 4.11 */
    if(setsockopt(ctx->sock, IPPROTO_TCP, TCP_FASTOPEN_CONNECT,
                  (void *)&optval, sizeof(optval)) < 0)
      infof(data, "Failed to enable TCP Fast Open on fd %" FMT_SOCKET_T,
            ctx->sock);

    rc = connect(ctx->sock, &ctx->addr.curl_sa_addr, ctx->addr.addrlen);
#elif defined(MSG_FASTOPEN) /* old Linux */
    if(Curl_conn_is_ssl(cf->conn, cf->sockindex))
      rc = connect(ctx->sock, &ctx->addr.curl_sa_addr, ctx->addr.addrlen);
    else
      rc = 0; /* Do nothing */
#endif
  }
  else {
    rc = connect(ctx->sock, &ctx->addr.curl_sa_addr,
                 (curl_socklen_t)ctx->addr.addrlen);
  }
  return rc;
}